

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  int *piVar5;
  int p1;
  int extraout_EDX;
  int p1_00;
  int extraout_EDX_00;
  int local_214;
  int local_210;
  int wstat;
  int child;
  char ch;
  taia now;
  taia deadline;
  iopause_fd x [3];
  char local_1b8 [8];
  char buf [256];
  int r;
  int fd;
  stat s;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  s.__glibc_reserved[2] = (__syscall_slong_t)argv;
  if ((argv[1] == (char *)0x0) || (argv[2] != (char *)0x0)) {
    usage();
  }
  dir = *(char **)(s.__glibc_reserved[2] + 8);
  iVar1 = pipe(selfpipe);
  if (iVar1 == -1) {
    fatal("unable to create selfpipe");
  }
  coe(selfpipe[0]);
  coe(selfpipe[1]);
  ndelay_on(selfpipe[0]);
  ndelay_on(selfpipe[1]);
  sig_block(sig_child);
  sig_catch(sig_child,s_child);
  sig_block(sig_term);
  sig_catch(sig_term,s_term);
  iVar1 = chdir(dir);
  if (iVar1 == -1) {
    fatal("unable to change to directory");
  }
  svd[0].pid = 0;
  svd[0].state = 0;
  svd[0].ctrl = 0;
  svd[0].want = 0;
  svd[0].islog = 0;
  svd[1].pid = 0;
  taia_now(&svd[0].start);
  iVar1 = stat("down",(stat *)&r);
  if (iVar1 != -1) {
    svd[0].want = 1;
  }
  iVar1 = stat("log",(stat *)&r);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != error_noent) {
      warn("unable to stat() ./log: ");
    }
  }
  else if (((uint)s.st_nlink & 0xf000) == 0x4000) {
    haslog = 1;
    svd[1].state = 0;
    svd[1].ctrl = 0;
    svd[1].want = 0;
    svd[1].islog = 1;
    taia_now(&svd[1].start);
    iVar1 = stat("log/down",(stat *)&r);
    if (iVar1 != -1) {
      svd[1].want = 1;
    }
    iVar1 = pipe(logpipe);
    if (iVar1 == -1) {
      fatal("unable to create log pipe");
    }
    coe(logpipe[0]);
    coe(logpipe[1]);
  }
  else {
    warnx("./log",(char *)0x0,": not a directory.");
  }
  iVar1 = mkdir("supervise",0x1c0);
  if (iVar1 == -1) {
    sVar4 = readlink("supervise",local_1b8,0x100);
    iVar1 = (int)sVar4;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      if ((*piVar3 != 2) && (piVar3 = __errno_location(), *piVar3 != 0x16)) {
        fatal("unable to readlink ./supervise");
      }
    }
    else {
      if (iVar1 == 0x100) {
        fatalx("unable to readlink ./supervise: ","name too long");
      }
      local_1b8[iVar1] = '\0';
      mkdir(local_1b8,0x1c0);
    }
  }
  svd[0].fdlock = open_append("supervise/lock");
  if (svd[0].fdlock == -1) {
    fatal("unable to open supervise/lock");
  }
  iVar1 = lock_exnb(svd[0].fdlock);
  if (iVar1 == -1) {
    fatal("unable to lock supervise/lock");
  }
  coe(svd[0].fdlock);
  if (haslog != 0) {
    iVar1 = mkdir("log/supervise",0x1c0);
    if (iVar1 == -1) {
      sVar4 = readlink("log/supervise",local_1b8,0x100);
      iVar1 = (int)sVar4;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        if ((*piVar3 != 2) && (piVar3 = __errno_location(), *piVar3 != 0x16)) {
          fatal("unable to readlink ./log/supervise");
        }
      }
      else {
        if (iVar1 == 0x100) {
          fatalx("unable to readlink ./log/supervise: ","name too long");
        }
        local_1b8[iVar1] = '\0';
        iVar1 = open_read(".");
        if (iVar1 == -1) {
          fatal("unable to open current directory");
        }
        iVar2 = chdir("./log");
        if (iVar2 == -1) {
          fatal("unable to change directory to ./log");
        }
        mkdir(local_1b8,0x1c0);
        iVar2 = fchdir(iVar1);
        if (iVar2 == -1) {
          fatal("unable to change back to service directory");
        }
        close(iVar1);
      }
    }
    svd[1].fdlock = open_append("log/supervise/lock");
    if (svd[1].fdlock == -1) {
      fatal("unable to open log/supervise/lock");
    }
    iVar1 = lock_ex(svd[1].fdlock);
    if (iVar1 == -1) {
      fatal("unable to lock log/supervise/lock");
    }
    coe(svd[1].fdlock);
  }
  fifo_make("supervise/control",0x180);
  iVar1 = stat("supervise/control",(stat *)&r);
  if (iVar1 == -1) {
    fatal("unable to stat supervise/control");
  }
  if (((uint)s.st_nlink & 0xf000) != 0x1000) {
    fatalx("supervise/control exists but is not a fifo","");
  }
  svd[0].fdcontrol = open_read("supervise/control");
  if (svd[0].fdcontrol == -1) {
    fatal("unable to open supervise/control");
  }
  coe(svd[0].fdcontrol);
  svd[0].fdcontrolwrite = open_write("supervise/control");
  if (svd[0].fdcontrolwrite == -1) {
    fatal("unable to open supervise/control");
  }
  coe(svd[0].fdcontrolwrite);
  update_status(svd);
  if (haslog != 0) {
    fifo_make("log/supervise/control",0x180);
    iVar1 = stat("supervise/control",(stat *)&r);
    if (iVar1 == -1) {
      fatal("unable to stat log/supervise/control");
    }
    if (((uint)s.st_nlink & 0xf000) != 0x1000) {
      fatalx("log/supervise/control exists but is not a fifo","");
    }
    svd[1].fdcontrol = open_read("log/supervise/control");
    if (svd[1].fdcontrol == -1) {
      fatal("unable to open log/supervise/control");
    }
    coe(svd[1].fdcontrol);
    svd[1].fdcontrolwrite = open_write("log/supervise/control");
    if (svd[1].fdcontrolwrite == -1) {
      fatal("unable to open log/supervise/control");
    }
    coe(svd[1].fdcontrolwrite);
    update_status(svd + 1);
  }
  fifo_make("supervise/ok",0x180);
  iVar1 = open_read("supervise/ok");
  if (iVar1 == -1) {
    fatal("unable to read supervise/ok");
  }
  coe(iVar1);
  if (haslog != 0) {
    fifo_make("log/supervise/ok",0x180);
    iVar1 = open_read("log/supervise/ok");
    if (iVar1 == -1) {
      fatal("unable to read log/supervise/ok");
    }
    coe(iVar1);
  }
  do {
    if (((haslog != 0) && (svd[1].pid == 0)) && (svd[1].want == 0)) {
      startservice(svd + 1);
    }
    if ((svd[0].pid == 0) && ((svd[0].want == 0 || (svd[0].state == 2)))) {
      startservice(svd);
    }
    deadline.atto._0_4_ = selfpipe[0];
    deadline.atto._4_2_ = 1;
    taia_now((taia *)&child);
    taia_uint((taia *)&now.atto,0xe10);
    taia_add((taia *)&now.atto,(taia *)&child,(taia *)&now.atto);
    sig_unblock(sig_term);
    sig_unblock(sig_child);
    piVar3 = &child;
    iopause((iopause_fd *)&deadline.atto,haslog + 2,(taia *)&now.atto,(taia *)piVar3);
    sig_block(sig_term);
    sig_block(sig_child);
    do {
      sVar4 = read(selfpipe[0],(void *)((long)&wstat + 3),1);
    } while (sVar4 == 1);
    while (local_210 = wait_nohang(&local_214), local_210 != 0) {
      if (local_210 == -1) {
        piVar5 = __errno_location();
        piVar3 = &error_intr;
        if (*piVar5 != error_intr) break;
      }
      if (local_210 == svd[0].pid) {
        svd[0].pid = 0;
        pidchanged = 1;
        svd[0].wstat = local_214;
        svd[0].ctrl = svd[0].ctrl & 0xfffffffe;
        if ((svd[0].state == 2) || (iVar1 = open_read("finish"), iVar1 == -1)) {
          svd[0].state = 0;
          taia_uint((taia *)&now.atto,1);
          taia_add((taia *)&now.atto,&svd[0].start,(taia *)&now.atto);
          taia_now(&svd[0].start);
          update_status(svd);
          iVar1 = taia_less(&svd[0].start,(taia *)&now.atto);
          if (iVar1 != 0) {
            sleep(1);
          }
          goto LAB_00103be0;
        }
        close(iVar1);
        svd[0].state = 2;
        update_status(svd);
      }
      else {
LAB_00103be0:
        if ((haslog != 0) && (local_210 == svd[1].pid)) {
          svd[1].pid = 0;
          pidchanged = 1;
          svd[1].state = 0;
          svd[1].ctrl = svd[1].ctrl & 0xfffffffe;
          taia_uint((taia *)&now.atto,1);
          taia_add((taia *)&now.atto,&svd[1].start,(taia *)&now.atto);
          taia_now(&svd[1].start);
          update_status(svd + 1);
          iVar1 = taia_less(&svd[1].start,(taia *)&now.atto);
          if (iVar1 != 0) {
            sleep(1);
          }
        }
      }
    }
    sVar4 = read(svd[0].fdcontrol,(void *)((long)&wstat + 3),1);
    iVar1 = p1;
    if (sVar4 == 1) {
      ctrl((EVP_PKEY_CTX *)svd,(int)wstat._3_1_,p1,piVar3);
      iVar1 = extraout_EDX;
    }
    if ((haslog != 0) &&
       (sVar4 = read(svd[1].fdcontrol,(void *)((long)&wstat + 3),1), iVar1 = p1_00, sVar4 == 1)) {
      ctrl((EVP_PKEY_CTX *)(svd + 1),(int)wstat._3_1_,p1_00,piVar3);
      iVar1 = extraout_EDX_00;
    }
    if (sigterm != 0) {
      ctrl((EVP_PKEY_CTX *)svd,0x78,iVar1,piVar3);
      sigterm = 0;
    }
    if ((svd[0].want == 2) && (svd[0].state == 0)) {
      if (svd[1].pid == 0) {
        _exit(0);
      }
      if (svd[1].want != 2) {
        svd[1].want = 2;
        update_status(svd + 1);
        iVar1 = close(logpipe[1]);
        if (iVar1 == -1) {
          warn("unable to close logpipe[1]");
        }
        iVar1 = close(logpipe[0]);
        if (iVar1 == -1) {
          warn("unable to close logpipe[0]");
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  int fd;
  int r;
  char buf[256];

  progname =argv[0];
  if (! argv[1] || argv[2]) usage();
  dir =argv[1];

  if (pipe(selfpipe) == -1) fatal("unable to create selfpipe");
  coe(selfpipe[0]);
  coe(selfpipe[1]);
  ndelay_on(selfpipe[0]);
  ndelay_on(selfpipe[1]);

  sig_block(sig_child);
  sig_catch(sig_child, s_child);
  sig_block(sig_term);
  sig_catch(sig_term, s_term);

  if (chdir(dir) == -1) fatal("unable to change to directory");
  svd[0].pid =0;
  svd[0].state =S_DOWN;
  svd[0].ctrl =C_NOOP;
  svd[0].want =W_UP;
  svd[0].islog =0;
  svd[1].pid =0;
  taia_now(&svd[0].start);
  if (stat("down", &s) != -1) svd[0].want =W_DOWN;

  if (stat("log", &s) == -1) {
    if (errno != error_noent)
      warn("unable to stat() ./log: ");
  }
  else {
    if (! S_ISDIR(s.st_mode))
      warnx("./log", 0, ": not a directory.");
    else {
      haslog =1;
      svd[1].state =S_DOWN;
      svd[1].ctrl =C_NOOP;
      svd[1].want =W_UP;
      svd[1].islog =1;
      taia_now(&svd[1].start);
      if (stat("log/down", &s) != -1)
        svd[1].want =W_DOWN;
      if (pipe(logpipe) == -1)
        fatal("unable to create log pipe");
      coe(logpipe[0]);
      coe(logpipe[1]);
    }
  }

  if (mkdir("supervise", 0700) == -1) {
    if ((r =readlink("supervise", buf, 256)) != -1) {
      if (r == 256)
        fatalx("unable to readlink ./supervise: ", "name too long");
      buf[r] =0;
      mkdir(buf, 0700);
    }
    else {
      if ((errno != ENOENT) && (errno != EINVAL))
        fatal("unable to readlink ./supervise");
    }
  }
  if ((svd[0].fdlock =open_append("supervise/lock")) == -1)
    fatal("unable to open supervise/lock");
  if (lock_exnb(svd[0].fdlock) == -1) fatal("unable to lock supervise/lock");
  coe(svd[0].fdlock);
  if (haslog) {
    if (mkdir("log/supervise", 0700) == -1) {
      if ((r =readlink("log/supervise", buf, 256)) != -1) {
        if (r == 256)
          fatalx("unable to readlink ./log/supervise: ", "name too long");
        buf[r] =0;
        if ((fd =open_read(".")) == -1)
          fatal("unable to open current directory");
        if (chdir("./log") == -1)
          fatal("unable to change directory to ./log");
        mkdir(buf, 0700);
        if (fchdir(fd) == -1)
          fatal("unable to change back to service directory");
        close(fd);
      }
      else {
        if ((errno != ENOENT) && (errno != EINVAL))
          fatal("unable to readlink ./log/supervise");
      }
    }
    if ((svd[1].fdlock =open_append("log/supervise/lock")) == -1)
      fatal("unable to open log/supervise/lock");
    if (lock_ex(svd[1].fdlock) == -1)
      fatal("unable to lock log/supervise/lock");
    coe(svd[1].fdlock);
  }

  fifo_make("supervise/control", 0600);
  if (stat("supervise/control", &s) == -1)
    fatal("unable to stat supervise/control");
  if (!S_ISFIFO(s.st_mode))
    fatalx("supervise/control exists but is not a fifo", "");
  if ((svd[0].fdcontrol =open_read("supervise/control")) == -1)
    fatal("unable to open supervise/control");
  coe(svd[0].fdcontrol);
  if ((svd[0].fdcontrolwrite =open_write("supervise/control")) == -1)
    fatal("unable to open supervise/control");
  coe(svd[0].fdcontrolwrite);
  update_status(&svd[0]);
  if (haslog) {
    fifo_make("log/supervise/control", 0600);
    if (stat("supervise/control", &s) == -1)
      fatal("unable to stat log/supervise/control");
    if (!S_ISFIFO(s.st_mode))
      fatalx("log/supervise/control exists but is not a fifo", "");
    if ((svd[1].fdcontrol =open_read("log/supervise/control")) == -1)
      fatal("unable to open log/supervise/control");
    coe(svd[1].fdcontrol);
    if ((svd[1].fdcontrolwrite =open_write("log/supervise/control")) == -1)
      fatal("unable to open log/supervise/control");
    coe(svd[1].fdcontrolwrite);
    update_status(&svd[1]);
  }
  fifo_make("supervise/ok",0600);
  if ((fd =open_read("supervise/ok")) == -1)
    fatal("unable to read supervise/ok");
  coe(fd);
  if (haslog) {
    fifo_make("log/supervise/ok",0600);
    if ((fd =open_read("log/supervise/ok")) == -1)
      fatal("unable to read log/supervise/ok");
    coe(fd);
  }
  for (;;) {
    iopause_fd x[3];
    struct taia deadline;
    struct taia now;
    char ch;

    if (haslog)
      if (! svd[1].pid && (svd[1].want == W_UP)) startservice(&svd[1]);
    if (! svd[0].pid)
      if ((svd[0].want == W_UP) || (svd[0].state == S_FINISH))
        startservice(&svd[0]);

    x[0].fd =selfpipe[0];
    x[0].events =IOPAUSE_READ;
    x[1].fd =svd[0].fdcontrol;
    x[1].events =IOPAUSE_READ;
    if (haslog) {
      x[2].fd =svd[1].fdcontrol;
      x[2].events =IOPAUSE_READ;
    }
    taia_now(&now);
    taia_uint(&deadline, 3600);
    taia_add(&deadline, &now, &deadline);

    sig_unblock(sig_term);
    sig_unblock(sig_child);
    iopause(x, 2 +haslog, &deadline, &now);
    sig_block(sig_term);
    sig_block(sig_child);

    while (read(selfpipe[0], &ch, 1) == 1)
      ;
    for (;;) {
      int child;
      int wstat;

      child =wait_nohang(&wstat);
      if (!child) break;
      if ((child == -1) && (errno != error_intr)) break;
      if (child == svd[0].pid) {
        svd[0].pid =0;
        pidchanged =1;
        svd[0].wstat =wstat;
        svd[0].ctrl &=~C_TERM;
        if (svd[0].state != S_FINISH)
          if ((fd =open_read("finish")) != -1) {
            close(fd);
            svd[0].state =S_FINISH;
            update_status(&svd[0]);
            continue;
          }
        svd[0].state =S_DOWN;
        taia_uint(&deadline, 1);
        taia_add(&deadline, &svd[0].start, &deadline);
        taia_now(&svd[0].start);
        update_status(&svd[0]);
        if (taia_less(&svd[0].start, &deadline)) sleep(1);
      }
      if (haslog) {
        if (child == svd[1].pid) {
          svd[1].pid =0;
          pidchanged =1;
          svd[1].state =S_DOWN;
          svd[1].ctrl &=~C_TERM;
          taia_uint(&deadline, 1);
          taia_add(&deadline, &svd[1].start, &deadline);
          taia_now(&svd[1].start);
          update_status(&svd[1]);
          if (taia_less(&svd[1].start, &deadline)) sleep(1);
        }
      }
    }
    if (read(svd[0].fdcontrol, &ch, 1) == 1) ctrl(&svd[0], ch);
    if (haslog)
      if (read(svd[1].fdcontrol, &ch, 1) == 1) ctrl(&svd[1], ch);

    if (sigterm) { ctrl(&svd[0], 'x'); sigterm =0; }

    if ((svd[0].want == W_EXIT) && (svd[0].state == S_DOWN)) {
      if (svd[1].pid == 0) _exit(0);
      if (svd[1].want != W_EXIT) {
        svd[1].want =W_EXIT;
        /* stopservice(&svd[1]); */
        update_status(&svd[1]);
        if (close(logpipe[1]) == -1) warn("unable to close logpipe[1]");
        if (close(logpipe[0]) == -1) warn("unable to close logpipe[0]");
      }
    }
  }
  _exit(0);
}